

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O2

void __thiscall TidyConfigParser::parseChecks(TidyConfigParser *this)

{
  char cVar1;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  int iVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined8 extraout_RAX;
  uint uVar4;
  ulong uVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  bool bVar6;
  uint uVar7;
  ulong unaff_R14;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  CheckStatus local_bc;
  string local_b8;
  string checkGroup;
  string local_78;
  TidyConfig *local_58;
  string checkName;
  ulong uVar3;
  
  local_58 = &this->config;
LAB_0016a544:
  checkGroup._M_dataplus._M_p = (pointer)&checkGroup.field_2;
  checkName._M_dataplus._M_p = (pointer)&checkName.field_2;
  if (((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) != 0) {
    return;
  }
  checkGroup._M_string_length = 0;
  checkGroup.field_2._M_local_buf[0] = '\0';
  checkName._M_string_length = 0;
  checkName.field_2._M_local_buf[0] = '\0';
  cVar1 = nextChar(this);
  uVar3 = CONCAT71(extraout_var,cVar1);
  while( true ) {
    uVar5 = uVar3 & 0xffffffff;
    uVar4 = (uint)uVar3;
    cVar1 = (char)uVar5;
    if (cVar1 != '\n') break;
    cVar1 = nextChar(this);
    uVar3 = CONCAT71(extraout_var_00,cVar1);
  }
  if ((uVar4 & 0xff) == 0x2d) {
    local_bc = DISABLED;
LAB_0016a5d7:
    uVar7 = (uint)unaff_R14;
    cVar1 = nextChar(this);
    if (cVar1 == '-') {
LAB_0016a670:
      bVar6 = false;
      while( true ) {
        while( true ) {
          uVar4 = (uint)uVar5;
          cVar1 = nextChar(this);
          unaff_R14 = CONCAT71(extraout_var_02,cVar1) & 0xffffffff;
          uVar7 = (uint)CONCAT71(extraout_var_02,cVar1);
          if (cVar1 != '*') break;
          if (checkName._M_string_length != 0) goto LAB_0016a871;
          bVar6 = true;
          toggleAllGroupChecks(this,&checkGroup,local_bc);
        }
        cVar1 = (char)unaff_R14;
        uVar4 = (uint)cVar1;
        uVar5 = (ulong)uVar4;
        if (cVar1 == ',') break;
        iVar2 = isalpha(uVar4);
        if ((cVar1 != '-') && (iVar2 == 0)) {
          if ((cVar1 == '\n') || (cVar1 == '\0')) goto LAB_0016a764;
          goto LAB_0016a9ba;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&checkName,cVar1);
      }
      toggleCheck(this,&checkGroup,&checkName,local_bc);
      cVar1 = nextChar(this);
      if (cVar1 != '\n') {
LAB_0016a83e:
        local_78.field_2._M_local_buf[0] = ',';
        fmt_00.size_ = 0x81;
        fmt_00.data_ = (char *)0x23;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)&local_78;
        local_78._M_dataplus._M_p._0_4_ = uVar4;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_b8,(v11 *)"Expected new line but found: ({}){}",fmt_00,args_00);
        reportErrorAndExit(this,&local_b8);
LAB_0016a871:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"Unexpected \'*\'",(allocator<char> *)&local_b8);
        reportErrorAndExit(this,&local_78);
LAB_0016a894:
        local_78.field_2._M_local_buf[0] = (char)uVar4;
        fmt_01.size_ = 0x81;
        fmt_01.data_ = (char *)0x2a;
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)&local_78;
        local_78._M_dataplus._M_p._0_4_ = uVar4;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_b8,(v11 *)"Expected \'*\' or a letter but found: ({}){}",fmt_01,args_01);
        reportErrorAndExit(this,&local_b8);
LAB_0016a8c6:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"Unexpected \'*\'",(allocator<char> *)&local_b8);
        reportErrorAndExit(this,&local_78);
        cVar1 = extraout_AL;
        goto LAB_0016a8e9;
      }
LAB_0016a73e:
      std::__cxx11::string::~string((string *)&checkName);
      std::__cxx11::string::~string((string *)&checkGroup);
      goto LAB_0016a544;
    }
    if (cVar1 != '*') {
      uVar4 = (uint)cVar1;
      iVar2 = isalpha(uVar4);
      if (iVar2 != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&checkGroup,cVar1);
        do {
          cVar1 = nextChar(this);
          uVar5 = CONCAT71(extraout_var_01,cVar1) & 0xffffffff;
          uVar4 = (uint)CONCAT71(extraout_var_01,cVar1);
          if (cVar1 == '-') break;
          cVar1 = (char)uVar5;
          uVar7 = (uint)cVar1;
          iVar2 = isalpha(uVar7);
          if (iVar2 == 0) {
            fmt.size_ = 0x81;
            fmt.data_ = (char *)0x2a;
            args.field_1.values_ = in_R9.values_;
            args.desc_ = (unsigned_long_long)&local_78;
            local_78._M_dataplus._M_p._0_4_ = uVar7;
            local_78.field_2._M_local_buf[0] = cVar1;
            ::fmt::v11::vformat_abi_cxx11_
                      (&local_b8,(v11 *)"Expected \'-\' or a letter but found: ({}){}",fmt,args);
            reportErrorAndExit(this,&local_b8);
            goto LAB_0016a83e;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&checkGroup,cVar1);
        } while (cVar1 != '-');
        goto LAB_0016a670;
      }
      goto LAB_0016a894;
    }
    if (checkGroup._M_string_length != 0) goto LAB_0016a8c6;
    TidyConfig::toggleAl(local_58,DISABLED);
    cVar1 = nextChar(this);
    if (cVar1 == ',') goto LAB_0016a73e;
    if ((cVar1 != '\n') && (cVar1 != '\0')) {
LAB_0016a8e9:
      local_78._M_dataplus._M_p._0_4_ = (uint)cVar1;
      fmt_02.size_ = 0x81;
      fmt_02.data_ = (char *)0x1e;
      args_02.field_1.values_ = in_R9.values_;
      args_02.desc_ = (unsigned_long_long)&local_78;
      local_78.field_2._M_local_buf[0] = cVar1;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_b8,(v11 *)"Expected \',\' but found: ({}){}",fmt_02,args_02);
      reportErrorAndExit(this,&local_b8);
LAB_0016a91e:
      local_78.field_2._M_local_buf[0] = (char)uVar4;
      fmt_03.size_ = 0x81;
      fmt_03.data_ = (char *)0x31;
      args_03.field_1.values_ = in_R9.values_;
      args_03.desc_ = (unsigned_long_long)&local_78;
      local_78._M_dataplus._M_p._0_4_ = uVar7;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_b8,(v11 *)"Expected \'-\' or \'*\' or a letter but found: ({}){}",fmt_03,
                 args_03);
      reportErrorAndExit(this,&local_b8);
      cVar1 = extraout_AL_00;
      goto LAB_0016a950;
    }
    while (cVar1 = peekChar(this), cVar1 == '\n') {
      nextChar(this);
    }
  }
  else {
    uVar7 = (uint)cVar1;
    unaff_R14 = (ulong)uVar7;
    iVar2 = isalpha(uVar7);
    if (iVar2 != 0) {
      local_bc = ENABLED;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&checkGroup,cVar1);
      goto LAB_0016a5d7;
    }
    if (cVar1 != '*') goto LAB_0016a91e;
    TidyConfig::toggleAl(local_58,ENABLED);
    cVar1 = nextChar(this);
    if (cVar1 == ',') {
      cVar1 = nextChar(this);
      if (cVar1 == '\n') goto LAB_0016a73e;
LAB_0016a950:
      local_78._M_dataplus._M_p._0_4_ = (uint)cVar1;
      fmt_04.size_ = 0x81;
      fmt_04.data_ = (char *)0x23;
      args_04.field_1.values_ = in_R9.values_;
      args_04.desc_ = (unsigned_long_long)&local_78;
      local_78.field_2._M_local_buf[0] = cVar1;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_b8,(v11 *)"Expected new line but found: ({}){}",fmt_04,args_04);
      reportErrorAndExit(this,&local_b8);
      cVar1 = extraout_AL_01;
LAB_0016a985:
      local_78._M_dataplus._M_p._0_4_ = (uint)cVar1;
      fmt_05.size_ = 0x81;
      fmt_05.data_ = (char *)0x1e;
      args_05.field_1.values_ = in_R9.values_;
      args_05.desc_ = (unsigned_long_long)&local_78;
      local_78.field_2._M_local_buf[0] = cVar1;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_b8,(v11 *)"Expected \',\' but found: ({}){}",fmt_05,args_05);
      reportErrorAndExit(this,&local_b8);
LAB_0016a9ba:
      local_78.field_2._M_local_buf[0] = (char)uVar4;
      fmt_06.size_ = 0x81;
      fmt_06.data_ = (char *)0x11;
      args_06.field_1.values_ = in_R9.values_;
      args_06.desc_ = (unsigned_long_long)&local_78;
      local_78._M_dataplus._M_p._0_4_ = uVar4;
      ::fmt::v11::vformat_abi_cxx11_(&local_b8,(v11 *)"Unexpected ({}){}",fmt_06,args_06);
      reportErrorAndExit(this,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&checkName);
      std::__cxx11::string::~string((string *)&checkGroup);
      _Unwind_Resume(extraout_RAX);
    }
    if ((cVar1 != '\n') && (cVar1 != '\0')) goto LAB_0016a985;
    while (cVar1 = peekChar(this), cVar1 == '\n') {
      nextChar(this);
    }
  }
LAB_0016a796:
  this->parserState = Initial;
  std::__cxx11::string::~string((string *)&checkName);
  std::__cxx11::string::~string((string *)&checkGroup);
  return;
LAB_0016a764:
  while (cVar1 = peekChar(this), cVar1 == '\n') {
    nextChar(this);
  }
  if (!bVar6) {
    toggleCheck(this,&checkGroup,&checkName,local_bc);
  }
  goto LAB_0016a796;
}

Assistant:

void TidyConfigParser::parseChecks() {
    while (!fileStream.eof()) {
        TidyConfig::CheckStatus newCheckState = TidyConfig::CheckStatus::ENABLED;
        bool checkGroupParsed = false;
        bool ruleParsed = false;
        std::string checkGroup;
        std::string checkName;

        // Get the first char
        char currentChar = nextChar();

        // If it is a new line ignore it and get the following char
        while (currentChar == '\n')
            currentChar = nextChar();

        if (currentChar == '-')
            newCheckState = TidyConfig::CheckStatus::DISABLED;
        else if (isalpha(currentChar))
            checkGroup.push_back(currentChar);
        else if (currentChar == '*') {
            toggleAllChecks(TidyConfig::CheckStatus::ENABLED);
            currentChar = nextChar();
            if (currentChar == '\n' || currentChar == 0) {
                while (peekChar() == '\n')
                    nextChar();
                parserState = TidyConfigParser::ParserState::Initial;
                return;
            }
            else if (currentChar == ',') {
                currentChar = nextChar();
                if (currentChar != '\n') {
                    reportErrorAndExit(fmt::format("Expected new line but found: ({}){}",
                                                   +currentChar, currentChar));
                }
                continue;
            }
            else {
                reportErrorAndExit(
                    fmt::format("Expected ',' but found: ({}){}", +currentChar, currentChar));
            }
        }
        else {
            reportErrorAndExit(fmt::format("Expected '-' or '*' or a letter but found: ({}){}",
                                           +currentChar, currentChar));
        }

        // Parse second char
        currentChar = nextChar();

        if (currentChar == '*') {
            if (checkGroup.size())
                reportErrorAndExit("Unexpected '*'");
            ruleParsed = true;
            toggleAllChecks(TidyConfig::CheckStatus::DISABLED);
        }
        else if (currentChar == '-')
            checkGroupParsed = true;
        else if (isalpha(currentChar))
            checkGroup.push_back(currentChar);
        else {
            reportErrorAndExit(fmt::format("Expected '*' or a letter but found: ({}){}",
                                           +currentChar, currentChar));
        }

        if (ruleParsed) {
            currentChar = nextChar();
            if (currentChar == '\n' || currentChar == 0) {
                while (peekChar() == '\n')
                    nextChar();
                parserState = TidyConfigParser::ParserState::Initial;
                return;
            }
            else if (currentChar != ',') {
                reportErrorAndExit(
                    fmt::format("Expected ',' but found: ({}){}", +currentChar, currentChar));
            }
            continue;
        }

        // Parse group name
        while (!checkGroupParsed) {
            currentChar = nextChar();
            if (currentChar == '-')
                checkGroupParsed = true;
            else if (isalpha(currentChar))
                checkGroup.push_back(currentChar);
            else {
                reportErrorAndExit(fmt::format("Expected '-' or a letter but found: ({}){}",
                                               +currentChar, currentChar));
            }
        }

        // Parse check name
        bool checkParsed = false;
        while (true) {
            currentChar = nextChar();
            if (currentChar == ',') {
                toggleCheck(checkGroup, checkName, newCheckState);
                if (nextChar() != '\n') {
                    reportErrorAndExit(fmt::format("Expected new line but found: ({}){}",
                                                   +currentChar, currentChar));
                }
                break;
            }
            else if (currentChar == '*') {
                if (checkName.size())
                    reportErrorAndExit("Unexpected '*'");
                toggleAllGroupChecks(checkGroup, newCheckState);
                checkParsed = true;
            }
            else if (isalpha(currentChar) || currentChar == '-') {
                checkName.push_back(currentChar);
            }
            else if (currentChar == '\n' || currentChar == 0) {
                while (peekChar() == '\n')
                    nextChar();
                if (!checkParsed)
                    toggleCheck(checkGroup, checkName, newCheckState);
                parserState = ParserState::Initial;
                return;
            }
            else {
                reportErrorAndExit(fmt::format("Unexpected ({}){}", +currentChar, currentChar));
            }
        }
    }
}